

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
brotli::MoveToFrontTransform
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  pointer __src;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mtf;
  allocator_type local_71;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  puVar3 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = puVar3;
  if (puVar3 == puVar4) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__,v);
  }
  else {
    while (puVar5 = puVar6, puVar3 = puVar3 + 1, puVar3 != puVar4) {
      puVar6 = puVar3;
      if (*puVar3 <= *puVar5) {
        puVar6 = puVar5;
      }
    }
    uVar1 = *puVar5;
    uVar2 = uVar1 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_68,(ulong)uVar2,&local_71);
    uVar7 = 0;
    do {
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = (uint)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar1 + 1 + (uint)(uVar2 == 0) != uVar7);
    local_70 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_71);
    __src = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_48 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    lVar12 = (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_48;
    if (lVar12 != 0) {
      lVar12 = lVar12 >> 2;
      local_38 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar7 = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      uVar10 = uVar7 + (uVar7 == 0);
      local_40 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      local_50 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
      lVar11 = 0;
      do {
        if (local_38 == __src) {
          uVar9 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar9 = uVar8;
            if (__src[uVar8] == local_48[lVar11]) break;
            uVar8 = uVar8 + 1;
            uVar9 = uVar10;
          } while (uVar10 != uVar8);
        }
        if (uVar7 <= uVar9) {
          __assert_fail("index < mtf.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/brotli_bit_stream.cc"
                        ,0x1ed,
                        "std::vector<uint32_t> brotli::MoveToFrontTransform(const std::vector<uint32_t> &)"
                       );
        }
        local_40[lVar11] = (uint)uVar9;
        uVar2 = __src[uVar9];
        if (uVar9 != 0) {
          memmove(local_50,__src,uVar9 << 2);
        }
        *__src = uVar2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar12 + (ulong)(lVar12 == 0));
    }
    __return_storage_ptr__ = local_70;
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_70;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MoveToFrontTransform(const std::vector<uint32_t>& v) {
  if (v.empty()) return v;
  uint32_t max_value = *std::max_element(v.begin(), v.end());
  std::vector<uint32_t> mtf(max_value + 1);
  for (uint32_t i = 0; i <= max_value; ++i) mtf[i] = i;
  std::vector<uint32_t> result(v.size());
  for (size_t i = 0; i < v.size(); ++i) {
    size_t index = IndexOf(mtf, v[i]);
    assert(index < mtf.size());
    result[i] = static_cast<uint32_t>(index);
    MoveToFront(&mtf, index);
  }
  return result;
}